

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfDwaCompressor.cpp
# Opt level: O2

void __thiscall
Imf_2_5::DwaCompressor::LossyDctEncoderBase::rleAc
          (LossyDctEncoderBase *this,half *block,unsigned_short **acPtr)

{
  int iVar1;
  int iVar2;
  unsigned_short uVar3;
  int iVar4;
  unsigned_short *puVar5;
  long lVar6;
  long lVar7;
  
  iVar1 = this->_numAcComp;
  puVar5 = *acPtr;
  iVar4 = 1;
  do {
    while( true ) {
      if (0x3f < iVar4) {
        return;
      }
      lVar7 = (long)iVar4;
      uVar3 = block[lVar7]._h;
      if (uVar3 == 0) break;
      *acPtr = puVar5 + 1;
      *puVar5 = uVar3;
      iVar1 = iVar1 + 1;
      this->_numAcComp = iVar1;
      iVar4 = iVar4 + 1;
      puVar5 = puVar5 + 1;
    }
    iVar2 = 0x40 - iVar4;
    for (lVar6 = 1; lVar7 + -0x3f + lVar6 != 1; lVar6 = lVar6 + 1) {
      if (block[lVar7 + lVar6]._h != 0) {
        if (lVar6 == 1) {
          uVar3 = 0;
          iVar2 = 1;
        }
        else {
          iVar2 = (int)lVar6;
          if (lVar7 + lVar6 == 0x40) {
            uVar3 = 0xff00;
          }
          else {
            uVar3 = (ushort)lVar6 | 0xff00;
          }
        }
        goto LAB_00533905;
      }
    }
    uVar3 = (ushort)(iVar4 == 0x3f) * 0x100 - 0x100;
LAB_00533905:
    *acPtr = puVar5 + 1;
    *puVar5 = uVar3;
    iVar1 = iVar1 + 1;
    this->_numAcComp = iVar1;
    iVar4 = iVar4 + iVar2;
    puVar5 = puVar5 + 1;
  } while( true );
}

Assistant:

void
DwaCompressor::LossyDctEncoderBase::rleAc
    (half *block,
     unsigned short *&acPtr)
{
    int dctComp              = 1; 
    unsigned short rleSymbol = 0x0;

    while (dctComp < 64)
    {
        int runLen = 1;
    
        //
        // If we don't have a 0, output verbatim
        //

        if (block[dctComp].bits() != rleSymbol)
        {
            *acPtr++ =  block[dctComp].bits();
            _numAcComp++;

            dctComp += runLen;
            continue;
        }

        //
        // We're sitting on a 0, so see how big the run is.
        //

        while ((dctComp+runLen < 64) && 
               (block[dctComp+runLen].bits() == rleSymbol))
        {
            runLen++;
        }

        //
        // If the run len is too small, just output verbatim
        // otherwise output our run token
        //
        // Originally, we wouldn't have a separate symbol for
        // "end of block". But in some experimentation, it looks
        // like using 0xff00 for "end of block" can save a bit
        // of space. 
        //

        if (runLen == 1)
        {
            runLen           = 1;
            *acPtr++ = block[dctComp].bits();
            _numAcComp++;

            //
            // Using 0xff00 for "end of block"
            //
        }
        else if (runLen + dctComp == 64)
        {
            //
            // Signal EOB
            //

            *acPtr++ = 0xff00;
            _numAcComp++;
        }
        else
        {
            // 
            // Signal normal run
            //

            *acPtr++   = 0xff00 | runLen;
            _numAcComp++;
        }

        //
        // Advance by runLen
        //

        dctComp += runLen;
    }
}